

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimitiveDisplayer.cpp
# Opt level: O3

void __thiscall
PrimitiveDisplayer::drawSquare
          (PrimitiveDisplayer *this,Vec2d *coords,GLfloat blockSize,Colour *colour,
          Colour *outlineColour,bool outline,Vec2d *rotationPoint,float rotation)

{
  GLfloat *pGVar1;
  undefined3 in_register_00000081;
  float fVar2;
  float fVar3;
  
  glPushMatrix();
  fVar2 = Vec2d::getX(coords);
  fVar3 = Vec2d::getY(coords);
  glTranslatef(fVar2,fVar3,0);
  pGVar1 = Colour::getColour3fv(colour);
  glColor3fv(pGVar1);
  glShadeModel(0x1d00);
  pGVar1 = getRotatedVertices(this,blockSize,rotation);
  glEnableClientState(0x8074);
  glVertexPointer(2,0x1406,0,pGVar1);
  pGVar1 = Colour::getColour3fv(colour);
  glColor3fv(pGVar1);
  glDrawArrays(7,0,4);
  if (CONCAT31(in_register_00000081,outline) != 0) {
    pGVar1 = Colour::getColour3fv(outlineColour);
    glColor3fv(pGVar1);
    glLineWidth(0x40000000);
    glDrawArrays(2,0,4);
  }
  glDisableClientState(0x8074);
  glPopMatrix();
  return;
}

Assistant:

void PrimitiveDisplayer::drawSquare(Vec2d* coords, GLfloat blockSize, Colour* colour, Colour* outlineColour, bool outline, Vec2d* rotationPoint, float rotation) {
    glPushMatrix();
        glTranslatef(coords->getX(), coords->getY(), 0.f);
    
        glColor3fv(colour->getColour3fv());
        
        glShadeModel(GL_FLAT);
        
        GLfloat* vertices = getRotatedVertices(blockSize, rotation);
    
        glEnableClientState(GL_VERTEX_ARRAY);
        
        glVertexPointer(2, GL_FLOAT, 0, vertices);
        
        glColor3fv(colour->getColour3fv());
        glDrawArrays(GL_QUADS, 0, 4);
        if (outline) {
            glColor3fv(outlineColour->getColour3fv());
            glLineWidth(2);
            glDrawArrays(GL_LINE_LOOP, 0, 4);
        }
        glDisableClientState(GL_VERTEX_ARRAY);
    glPopMatrix();
}